

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  string *psVar1;
  char *__s;
  size_t sVar2;
  string *psVar3;
  long lVar4;
  allocator<char> local_60 [32];
  string *local_40;
  allocator<char> local_31;
  
  lVar4 = 0;
  local_40 = __return_storage_ptr__;
  do {
    __s = (char *)environment_variables._M_len;
    if ((long)environment_variables._M_array << 3 == lVar4) {
LAB_00128fc6:
      psVar1 = local_40;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,local_60);
      return psVar1;
    }
    __s = getenv(*(char **)(this + lVar4));
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      sVar2 = strlen(__s);
      if (__s[sVar2 - 1] != '/') {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_31);
        psVar3 = (string *)std::__cxx11::string::append((ulong)local_60,'\x01');
        psVar1 = local_40;
        std::__cxx11::string::string((string *)local_40,psVar3);
        std::__cxx11::string::~string((string *)local_60);
        return psVar1;
      }
      goto LAB_00128fc6;
    }
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}